

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_unroller.cpp
# Opt level: O0

void __thiscall
spvtools::opt::anon_unknown_0::LoopUnrollerUtilsImpl::PartiallyUnrollResidualFactor
          (LoopUnrollerUtilsImpl *this,Loop *loop,size_t factor)

{
  IRContext *pIVar1;
  initializer_list<unsigned_int> init_list;
  initializer_list<unsigned_int> init_list_00;
  initializer_list<unsigned_int> init_list_01;
  int64_t this_00;
  bool bVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  Op OVar5;
  int iVar6;
  Instruction *pIVar7;
  BasicBlock *pBVar8;
  pointer pBVar9;
  reference this_01;
  pointer pLVar10;
  DefUseManager *pDVar11;
  Instruction *pIVar12;
  reference ppIVar13;
  LoopDescriptor *this_02;
  Loop *parent;
  LoopDescriptor *loop_descriptor;
  undefined1 local_1e8 [8];
  anon_class_16_2_deb4ee38 replace_use_outside_of_loop;
  uint32_t second_loop_induction;
  SmallVector<unsigned_int,_2UL> local_1c0;
  uint32_t local_194;
  iterator local_190;
  undefined8 local_188;
  SmallVector<unsigned_int,_2UL> local_180;
  uint32_t local_154;
  value_type pIStack_150;
  uint32_t initalizer_index;
  Instruction *old_induction;
  Instruction *new_induction;
  size_t index;
  vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> old_inductions
  ;
  vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> new_inductions
  ;
  SmallVector<unsigned_int,_2UL> local_f0;
  uint32_t local_c4;
  Instruction *pIStack_c0;
  uint32_t constant_id;
  Instruction *new_constant;
  int64_t remainder;
  Instruction *condition_check;
  DefUseManager *def_use_manager;
  undefined1 local_98 [8];
  InstructionBuilder builder;
  unique_ptr<spvtools::opt::Loop,_std::default_delete<spvtools::opt::Loop>_> new_loop;
  Instruction *original_conditional_branch;
  BasicBlock *new_exit_bb_raw;
  uint32_t new_merge_id;
  unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_> local_48;
  unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_> new_exit_bb
  ;
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_> local_28;
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_> new_label
  ;
  size_t factor_local;
  Loop *loop_local;
  LoopUnrollerUtilsImpl *this_local;
  
  new_label._M_t.
  super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
  ._M_t.
  super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
  .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl =
       (__uniq_ptr_data<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>,_true,_true>
        )(__uniq_ptr_data<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>,_true,_true>
          )factor;
  pIVar7 = (Instruction *)::operator_new(0x70);
  pIVar1 = this->context_;
  uVar3 = IRContext::TakeNextId(this->context_);
  memset(&new_exit_bb,0,0x18);
  std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::vector
            ((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)&new_exit_bb
            );
  opt::Instruction::Instruction(pIVar7,pIVar1,OpLabel,0,uVar3,(OperandList *)&new_exit_bb);
  std::unique_ptr<spvtools::opt::Instruction,std::default_delete<spvtools::opt::Instruction>>::
  unique_ptr<std::default_delete<spvtools::opt::Instruction>,void>
            ((unique_ptr<spvtools::opt::Instruction,std::default_delete<spvtools::opt::Instruction>>
              *)&local_28,pIVar7);
  std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector
            ((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)&new_exit_bb
            );
  pBVar8 = (BasicBlock *)::operator_new(0x88);
  std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>::
  unique_ptr((unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
              *)&stack0xffffffffffffffb0,&local_28);
  BasicBlock::BasicBlock
            (pBVar8,(unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                     *)&stack0xffffffffffffffb0);
  std::unique_ptr<spvtools::opt::BasicBlock,std::default_delete<spvtools::opt::BasicBlock>>::
  unique_ptr<std::default_delete<spvtools::opt::BasicBlock>,void>
            ((unique_ptr<spvtools::opt::BasicBlock,std::default_delete<spvtools::opt::BasicBlock>> *
             )&local_48,pBVar8);
  std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>::
  ~unique_ptr((unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
               *)&stack0xffffffffffffffb0);
  pBVar9 = std::
           unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>::
           operator->(&local_48);
  BasicBlock::SetParent(pBVar9,this->function_);
  pBVar9 = std::
           unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>::
           operator->(&local_48);
  uVar3 = BasicBlock::id(pBVar9);
  std::
  vector<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
  ::push_back(&this->blocks_to_add_,&local_48);
  this_01 = std::
            vector<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
            ::operator[](&this->blocks_to_add_,0);
  pBVar9 = std::
           unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>::
           get(this_01);
  BasicBlock::tail((BasicBlock *)&new_loop);
  pIVar7 = utils::IntrusiveList<spvtools::opt::Instruction>::
           iterator_template<spvtools::opt::Instruction>::operator*
                     ((iterator_template<spvtools::opt::Instruction> *)&new_loop);
  MakeUnique<spvtools::opt::Loop,spvtools::opt::Loop&>
            ((spvtools *)&builder.preserved_analyses_,loop);
  pLVar10 = std::unique_ptr<spvtools::opt::Loop,_std::default_delete<spvtools::opt::Loop>_>::
            operator->((unique_ptr<spvtools::opt::Loop,_std::default_delete<spvtools::opt::Loop>_> *
                       )&builder.preserved_analyses_);
  Loop::ClearBlocks(pLVar10);
  pLVar10 = std::unique_ptr<spvtools::opt::Loop,_std::default_delete<spvtools::opt::Loop>_>::get
                      ((unique_ptr<spvtools::opt::Loop,_std::default_delete<spvtools::opt::Loop>_> *
                       )&builder.preserved_analyses_);
  DuplicateLoop(this,loop,pLVar10);
  pBVar8 = Loop::GetMergeBlock(loop);
  AddBlocksToFunction(this,pBVar8);
  std::
  vector<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
  ::clear(&this->blocks_to_add_);
  InstructionBuilder::InstructionBuilder
            ((InstructionBuilder *)local_98,this->context_,pBVar9,kAnalysisNone);
  pLVar10 = std::unique_ptr<spvtools::opt::Loop,_std::default_delete<spvtools::opt::Loop>_>::
            operator->((unique_ptr<spvtools::opt::Loop,_std::default_delete<spvtools::opt::Loop>_> *
                       )&builder.preserved_analyses_);
  pBVar8 = Loop::GetHeaderBlock(pLVar10);
  uVar4 = BasicBlock::id(pBVar8);
  InstructionBuilder::AddBranch((InstructionBuilder *)local_98,uVar4);
  this->loop_condition_block_ = (this->state_).new_condition_block;
  this->loop_induction_variable_ = (this->state_).new_phi;
  pLVar10 = std::unique_ptr<spvtools::opt::Loop,_std::default_delete<spvtools::opt::Loop>_>::get
                      ((unique_ptr<spvtools::opt::Loop,_std::default_delete<spvtools::opt::Loop>_> *
                       )&builder.preserved_analyses_);
  Unroll(this,pLVar10,
         (size_t)new_label._M_t.
                 super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                 .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl);
  pLVar10 = std::unique_ptr<spvtools::opt::Loop,_std::default_delete<spvtools::opt::Loop>_>::get
                      ((unique_ptr<spvtools::opt::Loop,_std::default_delete<spvtools::opt::Loop>_> *
                       )&builder.preserved_analyses_);
  LinkLastPhisToStart(this,pLVar10);
  pLVar10 = std::unique_ptr<spvtools::opt::Loop,_std::default_delete<spvtools::opt::Loop>_>::get
                      ((unique_ptr<spvtools::opt::Loop,_std::default_delete<spvtools::opt::Loop>_> *
                       )&builder.preserved_analyses_);
  AddBlocksToLoop(this,pLVar10);
  pLVar10 = std::unique_ptr<spvtools::opt::Loop,_std::default_delete<spvtools::opt::Loop>_>::
            operator->((unique_ptr<spvtools::opt::Loop,_std::default_delete<spvtools::opt::Loop>_> *
                       )&builder.preserved_analyses_);
  pBVar8 = Loop::GetMergeBlock(pLVar10);
  std::unique_ptr<spvtools::opt::BasicBlock,std::default_delete<spvtools::opt::BasicBlock>>::
  unique_ptr<std::default_delete<spvtools::opt::BasicBlock>,void>
            ((unique_ptr<spvtools::opt::BasicBlock,std::default_delete<spvtools::opt::BasicBlock>> *
             )&def_use_manager,pBVar8);
  std::
  vector<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
  ::push_back(&this->blocks_to_add_,(value_type *)&def_use_manager);
  std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>::
  ~unique_ptr((unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
               *)&def_use_manager);
  pBVar8 = Loop::GetMergeBlock(loop);
  AddBlocksToFunction(this,pBVar8);
  IRContext::InvalidateAnalysesExceptFor(this->context_,kAnalysisLoopAnalysis);
  pDVar11 = IRContext::get_def_use_mgr(this->context_);
  condition_check = (Instruction *)pDVar11;
  uVar4 = opt::Instruction::GetSingleWordOperand(pIVar7,0);
  remainder = (int64_t)analysis::DefUseManager::GetDef(pDVar11,uVar4);
  OVar5 = opt::Instruction::opcode((Instruction *)remainder);
  bVar2 = Loop::IsSupportedCondition(loop,OVar5);
  if (!bVar2) {
    __assert_fail("loop->IsSupportedCondition(condition_check->opcode())",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/loop_unroller.cpp"
                  ,0x1bb,
                  "void spvtools::opt::(anonymous namespace)::LoopUnrollerUtilsImpl::PartiallyUnrollResidualFactor(Loop *, size_t)"
                 );
  }
  OVar5 = opt::Instruction::opcode((Instruction *)remainder);
  pIVar12 = (Instruction *)
            Loop::GetResidualConditionValue
                      (OVar5,this->loop_init_value_,this->loop_step_value_,
                       this->number_of_loop_iterations_,
                       (size_t)new_label._M_t.
                               super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                               .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>.
                               _M_head_impl);
  new_constant = pIVar12;
  iVar6 = std::numeric_limits<int>::min();
  pIVar7 = new_constant;
  bVar2 = false;
  if ((long)iVar6 < (long)pIVar12) {
    iVar6 = std::numeric_limits<int>::max();
    bVar2 = (long)pIVar7 < (long)iVar6;
  }
  if (!bVar2) {
    __assert_fail("remainder > std::numeric_limits<int32_t>::min() && remainder < std::numeric_limits<int32_t>::max()"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/loop_unroller.cpp"
                  ,0x1c3,
                  "void spvtools::opt::(anonymous namespace)::LoopUnrollerUtilsImpl::PartiallyUnrollResidualFactor(Loop *, size_t)"
                 );
  }
  pIStack_c0 = (Instruction *)0x0;
  if ((long)new_constant < 0) {
    pIStack_c0 = InstructionBuilder::GetSintConstant
                           ((InstructionBuilder *)local_98,(uint32_t)new_constant);
  }
  else {
    pIStack_c0 = InstructionBuilder::GetUintConstant
                           ((InstructionBuilder *)local_98,(uint32_t)new_constant);
  }
  new_inductions.
  super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = opt::Instruction::result_id(pIStack_c0);
  this_00 = remainder;
  init_list_01._M_len = 1;
  init_list_01._M_array =
       (iterator)
       ((long)&new_inductions.
               super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage + 4);
  local_c4 = new_inductions.
             super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
  utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_f0,init_list_01);
  opt::Instruction::SetInOperand((Instruction *)this_00,1,&local_f0);
  utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_f0);
  std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::vector
            ((vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> *)
             &old_inductions.
              super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  pLVar10 = std::unique_ptr<spvtools::opt::Loop,_std::default_delete<spvtools::opt::Loop>_>::
            operator->((unique_ptr<spvtools::opt::Loop,_std::default_delete<spvtools::opt::Loop>_> *
                       )&builder.preserved_analyses_);
  Loop::GetInductionVariables
            (pLVar10,(vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                      *)&old_inductions.
                         super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::vector
            ((vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> *)
             &index);
  Loop::GetInductionVariables
            (loop,(vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                   *)&index);
  new_induction = (Instruction *)0x0;
  while( true ) {
    pIVar7 = new_induction;
    pIVar12 = (Instruction *)
              std::
              vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::
              size((vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                    *)&old_inductions.
                       super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
    if (pIVar12 <= pIVar7) break;
    ppIVar13 = std::
               vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::
               operator[]((vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                           *)&old_inductions.
                              super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage,
                          (size_type)new_induction);
    old_induction = *ppIVar13;
    ppIVar13 = std::
               vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::
               operator[]((vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                           *)&index,(size_type)new_induction);
    pIStack_150 = *ppIVar13;
    pLVar10 = std::unique_ptr<spvtools::opt::Loop,_std::default_delete<spvtools::opt::Loop>_>::
              operator->((unique_ptr<spvtools::opt::Loop,_std::default_delete<spvtools::opt::Loop>_>
                          *)&builder.preserved_analyses_);
    pBVar8 = Loop::GetPreHeaderBlock(pLVar10);
    local_154 = GetPhiIndexFromLabel(pBVar8,pIStack_150);
    pIVar7 = old_induction;
    uVar4 = local_154 - 1;
    local_194 = opt::Instruction::result_id(pIStack_150);
    local_190 = &local_194;
    local_188 = 1;
    init_list_00._M_len = 1;
    init_list_00._M_array = local_190;
    utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_180,init_list_00);
    opt::Instruction::SetInOperand(pIVar7,uVar4,&local_180);
    utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_180);
    pIVar7 = old_induction;
    uVar4 = local_154;
    init_list._M_len = 1;
    init_list._M_array = (iterator)&replace_use_outside_of_loop.field_0xc;
    replace_use_outside_of_loop._12_4_ = uVar3;
    utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_1c0,init_list);
    opt::Instruction::SetInOperand(pIVar7,uVar4,&local_1c0);
    utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_1c0);
    replace_use_outside_of_loop.loop._0_4_ = opt::Instruction::result_id(old_induction);
    local_1e8 = (undefined1  [8])loop;
    replace_use_outside_of_loop.second_loop_induction = (uint32_t)replace_use_outside_of_loop.loop;
    pDVar11 = IRContext::get_def_use_mgr(this->context_);
    pIVar7 = pIStack_150;
    std::function<void(spvtools::opt::Instruction*,unsigned_int)>::
    function<spvtools::opt::(anonymous_namespace)::LoopUnrollerUtilsImpl::PartiallyUnrollResidualFactor(spvtools::opt::Loop*,unsigned_long)::__0&,void>
              ((function<void(spvtools::opt::Instruction*,unsigned_int)> *)&loop_descriptor,
               (anon_class_16_2_deb4ee38 *)local_1e8);
    analysis::DefUseManager::ForEachUse
              (pDVar11,pIVar7,
               (function<void_(spvtools::opt::Instruction_*,_unsigned_int)> *)&loop_descriptor);
    std::function<void_(spvtools::opt::Instruction_*,_unsigned_int)>::~function
              ((function<void_(spvtools::opt::Instruction_*,_unsigned_int)> *)&loop_descriptor);
    new_induction =
         (Instruction *)
         ((long)&(new_induction->super_IntrusiveNodeBase<spvtools::opt::Instruction>).
                 _vptr_IntrusiveNodeBase + 1);
  }
  IRContext::InvalidateAnalysesExceptFor(this->context_,kAnalysisLoopAnalysis);
  pIVar1 = this->context_;
  pBVar8 = Loop::GetMergeBlock(loop);
  uVar4 = BasicBlock::id(pBVar8);
  IRContext::ReplaceAllUsesWith(pIVar1,uVar4,uVar3);
  this_02 = IRContext::GetLoopDescriptor(this->context_,this->function_);
  parent = Loop::GetParent(loop);
  LoopDescriptor::AddLoop
            (this_02,(unique_ptr<spvtools::opt::Loop,_std::default_delete<spvtools::opt::Loop>_> *)
                     &builder.preserved_analyses_,parent);
  RemoveDeadInstructions(this);
  std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::~vector
            ((vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> *)
             &index);
  std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::~vector
            ((vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> *)
             &old_inductions.
              super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::unique_ptr<spvtools::opt::Loop,_std::default_delete<spvtools::opt::Loop>_>::~unique_ptr
            ((unique_ptr<spvtools::opt::Loop,_std::default_delete<spvtools::opt::Loop>_> *)
             &builder.preserved_analyses_);
  std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>::
  ~unique_ptr(&local_48);
  std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>::
  ~unique_ptr(&local_28);
  return;
}

Assistant:

void LoopUnrollerUtilsImpl::PartiallyUnrollResidualFactor(Loop* loop,
                                                          size_t factor) {
  // TODO(1841): Handle id overflow.
  std::unique_ptr<Instruction> new_label{new Instruction(
      context_, spv::Op::OpLabel, 0, context_->TakeNextId(), {})};
  std::unique_ptr<BasicBlock> new_exit_bb{new BasicBlock(std::move(new_label))};
  new_exit_bb->SetParent(&function_);

  // Save the id of the block before we move it.
  uint32_t new_merge_id = new_exit_bb->id();

  // Add the block the list of blocks to add, we want this merge block to be
  // right at the start of the new blocks.
  blocks_to_add_.push_back(std::move(new_exit_bb));
  BasicBlock* new_exit_bb_raw = blocks_to_add_[0].get();
  Instruction& original_conditional_branch = *loop_condition_block_->tail();
  // Duplicate the loop, providing access to the blocks of both loops.
  // This is a naked new due to the VS2013 requirement of not having unique
  // pointers in vectors, as it will be inserted into a vector with
  // loop_descriptor.AddLoop.
  std::unique_ptr<Loop> new_loop = MakeUnique<Loop>(*loop);

  // Clear the basic blocks of the new loop.
  new_loop->ClearBlocks();

  DuplicateLoop(loop, new_loop.get());

  // Add the blocks to the function.
  AddBlocksToFunction(loop->GetMergeBlock());
  blocks_to_add_.clear();

  // Create a new merge block for the first loop.
  InstructionBuilder builder{context_, new_exit_bb_raw};
  // Make the first loop branch to the second.
  builder.AddBranch(new_loop->GetHeaderBlock()->id());

  loop_condition_block_ = state_.new_condition_block;
  loop_induction_variable_ = state_.new_phi;
  // Unroll the new loop by the factor with the usual -1 to account for the
  // existing block iteration.
  Unroll(new_loop.get(), factor);

  LinkLastPhisToStart(new_loop.get());
  AddBlocksToLoop(new_loop.get());

  // Add the new merge block to the back of the list of blocks to be added. It
  // needs to be the last block added to maintain dominator order in the binary.
  blocks_to_add_.push_back(
      std::unique_ptr<BasicBlock>(new_loop->GetMergeBlock()));

  // Add the blocks to the function.
  AddBlocksToFunction(loop->GetMergeBlock());

  // Reset the usedef analysis.
  context_->InvalidateAnalysesExceptFor(
      IRContext::Analysis::kAnalysisLoopAnalysis);
  analysis::DefUseManager* def_use_manager = context_->get_def_use_mgr();

  // The loop condition.
  Instruction* condition_check = def_use_manager->GetDef(
      original_conditional_branch.GetSingleWordOperand(0));

  // This should have been checked by the LoopUtils::CanPerformUnroll function
  // before entering this.
  assert(loop->IsSupportedCondition(condition_check->opcode()));

  // We need to account for the initial body when calculating the remainder.
  int64_t remainder = Loop::GetResidualConditionValue(
      condition_check->opcode(), loop_init_value_, loop_step_value_,
      number_of_loop_iterations_, factor);

  assert(remainder > std::numeric_limits<int32_t>::min() &&
         remainder < std::numeric_limits<int32_t>::max());

  Instruction* new_constant = nullptr;

  // If the remainder is negative then we add a signed constant, otherwise just
  // add an unsigned constant.
  if (remainder < 0) {
    new_constant = builder.GetSintConstant(static_cast<int32_t>(remainder));
  } else {
    new_constant = builder.GetUintConstant(static_cast<int32_t>(remainder));
  }

  uint32_t constant_id = new_constant->result_id();

  // Update the condition check.
  condition_check->SetInOperand(1, {constant_id});

  // Update the next phi node. The phi will have a constant value coming in from
  // the preheader block. For the duplicated loop we need to update the constant
  // to be the amount of iterations covered by the first loop and the incoming
  // block to be the first loops new merge block.
  std::vector<Instruction*> new_inductions;
  new_loop->GetInductionVariables(new_inductions);

  std::vector<Instruction*> old_inductions;
  loop->GetInductionVariables(old_inductions);
  for (size_t index = 0; index < new_inductions.size(); ++index) {
    Instruction* new_induction = new_inductions[index];
    Instruction* old_induction = old_inductions[index];
    // Get the index of the loop initalizer, the value coming in from the
    // preheader.
    uint32_t initalizer_index =
        GetPhiIndexFromLabel(new_loop->GetPreHeaderBlock(), old_induction);

    // Replace the second loop initalizer with the phi from the first
    new_induction->SetInOperand(initalizer_index - 1,
                                {old_induction->result_id()});
    new_induction->SetInOperand(initalizer_index, {new_merge_id});

    // If the use of the first loop induction variable is outside of the loop
    // then replace that use with the second loop induction variable.
    uint32_t second_loop_induction = new_induction->result_id();
    auto replace_use_outside_of_loop = [loop, second_loop_induction](
                                           Instruction* user,
                                           uint32_t operand_index) {
      if (!loop->IsInsideLoop(user)) {
        user->SetOperand(operand_index, {second_loop_induction});
      }
    };

    context_->get_def_use_mgr()->ForEachUse(old_induction,
                                            replace_use_outside_of_loop);
  }

  context_->InvalidateAnalysesExceptFor(
      IRContext::Analysis::kAnalysisLoopAnalysis);

  context_->ReplaceAllUsesWith(loop->GetMergeBlock()->id(), new_merge_id);

  LoopDescriptor& loop_descriptor = *context_->GetLoopDescriptor(&function_);

  loop_descriptor.AddLoop(std::move(new_loop), loop->GetParent());

  RemoveDeadInstructions();
}